

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StartResumePdu.cpp
# Opt level: O0

bool __thiscall DIS::StartResumePdu::operator==(StartResumePdu *this,StartResumePdu *rhs)

{
  bool bVar1;
  bool local_19;
  bool ivarsEqual;
  StartResumePdu *rhs_local;
  StartResumePdu *this_local;
  
  local_19 = SimulationManagementFamilyPdu::operator==
                       (&this->super_SimulationManagementFamilyPdu,
                        &rhs->super_SimulationManagementFamilyPdu);
  bVar1 = ClockTime::operator==(&this->_realWorldTime,&rhs->_realWorldTime);
  if (!bVar1) {
    local_19 = false;
  }
  bVar1 = ClockTime::operator==(&this->_simulationTime,&rhs->_simulationTime);
  if (!bVar1) {
    local_19 = false;
  }
  if (this->_requestID != rhs->_requestID) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool StartResumePdu::operator ==(const StartResumePdu& rhs) const
{
    bool ivarsEqual = true;

    ivarsEqual = SimulationManagementFamilyPdu::operator==(rhs);

    if (!(_realWorldTime == rhs._realWorldTime))
        ivarsEqual = false;
    if (!(_simulationTime == rhs._simulationTime))
        ivarsEqual = false;
    if (!(_requestID == rhs._requestID))
        ivarsEqual = false;

    return ivarsEqual;
}